

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

GCproto * lj_bcread(LexState *ls)

{
  char **pp;
  lua_State *L;
  uint64_t uVar1;
  uint32_t uVar2;
  size_t lenx;
  GCstr *pGVar3;
  GCproto *pGVar4;
  char *pcVar5;
  TValue *pTVar6;
  lua_State *plVar7;
  char *pcVar8;
  
  L = ls->L;
  pcVar8 = ls->p;
  ls->lastline = *(int *)&L->top - (int)(L->stack).ptr64;
  (ls->sb).w = (ls->sb).b;
  pp = &ls->p;
  if ((uint)(*(int *)&ls->pe - (int)pcVar8) < 0xd) {
    bcread_fill(ls,0xd,0);
    pcVar8 = ls->p;
  }
  *pp = pcVar8 + 1;
  if (((*pcVar8 == 'L') && (*pp = pcVar8 + 2, pcVar8[1] == 'J')) &&
     (*pp = pcVar8 + 3, pcVar8[2] == '\x02')) {
    uVar2 = lj_buf_ruleb128(pp);
    ls->level = uVar2;
    if ((uVar2 & 0xfffffff8) == 8) {
      if (((uVar2 & 4) != 0) && (plVar7 = ls->L, *(long *)((plVar7->glref).ptr64 + 0x180) == 0)) {
        pTVar6 = plVar7->top;
        uVar1 = (plVar7->stack).ptr64;
        luaopen_ffi(plVar7);
        plVar7->top = (TValue *)((long)pTVar6 + ((plVar7->stack).ptr64 - uVar1));
      }
      if ((uVar2 & 2) == 0) {
        uVar2 = lj_buf_ruleb128(pp);
        pcVar8 = ls->p;
        if ((uint)(*(int *)&ls->pe - (int)pcVar8) < uVar2) {
          bcread_fill(ls,uVar2,1);
          pcVar8 = ls->p;
        }
        plVar7 = ls->L;
        lenx = (size_t)uVar2;
        ls->p = pcVar8 + lenx;
      }
      else {
        plVar7 = ls->L;
        pcVar8 = ls->chunkarg;
        lenx = strlen(pcVar8);
      }
      pGVar3 = lj_str_new(plVar7,pcVar8,lenx);
      ls->chunkname = pGVar3;
      while( true ) {
        pcVar8 = ls->p;
        pcVar5 = ls->pe;
        if ((pcVar8 < pcVar5) && (*pcVar8 == '\0')) break;
        if ((uint)((int)pcVar5 - (int)pcVar8) < 5) {
          bcread_fill(ls,5,0);
        }
        uVar2 = lj_buf_ruleb128(pp);
        pcVar8 = ls->p;
        pcVar5 = ls->pe;
        if (uVar2 == 0) goto LAB_00140e8d;
        if ((uint)((int)pcVar5 - (int)pcVar8) < uVar2) {
          bcread_fill(ls,uVar2,1);
          pcVar8 = ls->p;
        }
        pGVar4 = lj_bcread_proto(ls);
        if (ls->p != pcVar8 + uVar2) goto LAB_00140f00;
        L->top->u64 = (ulong)pGVar4 | 0xfffc000000000000;
        pTVar6 = L->top;
        L->top = pTVar6 + 1;
        if ((TValue *)(L->maxstack).ptr64 <= pTVar6 + 1) {
          lj_state_growstack1(L);
        }
      }
      pcVar8 = pcVar8 + 1;
      *pp = pcVar8;
LAB_00140e8d:
      if (((pcVar5 == pcVar8) || (ls->endmark != 0)) &&
         (pTVar6 = L->top + -1, pTVar6 == (TValue *)((long)ls->lastline + (L->stack).ptr64))) {
        L->top = pTVar6;
        return (GCproto *)(pTVar6->u64 & 0x7fffffffffff);
      }
LAB_00140f00:
      bcread_error((LexState *)ls->L,(ErrMsg)ls->chunkarg);
    }
  }
  bcread_error((LexState *)ls->L,(ErrMsg)ls->chunkarg);
}

Assistant:

GCproto *lj_bcread(LexState *ls)
{
  lua_State *L = ls->L;
  lj_assertLS(ls->c == BCDUMP_HEAD1, "bad bytecode header");
  bcread_savetop(L, ls, L->top);
  lj_buf_reset(&ls->sb);
  /* Check for a valid bytecode dump header. */
  if (!bcread_header(ls))
    bcread_error(ls, LJ_ERR_BCFMT);
  for (;;) {  /* Process all prototypes in the bytecode dump. */
    GCproto *pt;
    MSize len;
    const char *startp;
    /* Read length. */
    if (ls->p < ls->pe && ls->p[0] == 0) {  /* Shortcut EOF. */
      ls->p++;
      break;
    }
    bcread_want(ls, 5);
    len = bcread_uleb128(ls);
    if (!len) break;  /* EOF */
    bcread_need(ls, len);
    startp = ls->p;
    pt = lj_bcread_proto(ls);
    if (ls->p != startp + len)
      bcread_error(ls, LJ_ERR_BCBAD);
    setprotoV(L, L->top, pt);
    incr_top(L);
  }
  if ((ls->pe != ls->p && !ls->endmark) || L->top-1 != bcread_oldtop(L, ls))
    bcread_error(ls, LJ_ERR_BCBAD);
  /* Pop off last prototype. */
  L->top--;
  return protoV(L->top);
}